

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cc
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  _func_void__Any_data_ptr *__tmp_2;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  long lVar9;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>
  __l;
  deque<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_> timers
  ;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  commands;
  t_loop loop;
  allocator_type local_37a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_379;
  undefined4 *local_378;
  undefined8 local_370;
  undefined4 local_368;
  uint uStack_364;
  undefined5 uStack_360;
  undefined2 local_35b;
  undefined1 local_359;
  undefined4 *local_358;
  undefined8 local_350;
  undefined4 local_348;
  uint uStack_344;
  undefined2 local_33b;
  char local_339;
  _Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
  local_338;
  undefined4 *local_2e8;
  undefined8 local_2e0;
  undefined4 local_2d8;
  uint uStack_2d4;
  undefined5 uStack_2d0;
  undefined2 local_2cb;
  undefined1 local_2c9;
  undefined4 *local_2c8;
  undefined8 local_2c0;
  undefined4 local_2b8;
  undefined2 uStack_2b4;
  undefined2 uStack_2b2;
  undefined2 local_2aa;
  undefined1 *local_2a8;
  undefined8 local_2a0;
  undefined1 local_298;
  undefined1 uStack_297;
  undefined1 uStack_296;
  undefined5 uStack_295;
  undefined4 local_28d;
  undefined1 local_289;
  undefined4 *local_288;
  undefined8 local_280;
  undefined4 local_278;
  uint uStack_274;
  undefined5 uStack_270;
  undefined2 local_26b;
  undefined1 local_269;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  local_268;
  t_loop local_238 [96];
  undefined1 local_1d8 [32];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>
  local_1b8;
  undefined4 *local_178;
  undefined8 local_170;
  undefined4 local_168;
  undefined1 local_164;
  undefined8 local_163;
  undefined2 local_15b;
  undefined1 local_159;
  undefined8 local_158;
  undefined8 uStack_150;
  code *local_148;
  code *local_140;
  undefined4 *local_138;
  undefined8 local_130;
  undefined4 local_128;
  undefined1 local_124;
  undefined8 local_123;
  undefined2 local_11b;
  undefined1 local_119;
  t_loop *local_118;
  undefined8 uStack_110;
  code *local_108;
  code *pcStack_100;
  undefined2 *local_f8;
  undefined8 local_f0;
  undefined2 local_e8;
  undefined1 local_e6;
  undefined4 local_dd;
  undefined1 local_d9;
  t_loop *local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  code *pcStack_c0;
  undefined4 *local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined2 local_a4;
  undefined2 local_9a;
  _Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
  *local_98;
  t_loop *ptStack_90;
  code *local_88;
  code *pcStack_80;
  undefined4 *local_78 [2];
  undefined1 local_68 [13];
  undefined2 local_5b;
  undefined1 local_59;
  _Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
  *local_58;
  undefined8 uStack_50;
  code *local_48 [3];
  
  suisha::t_loop::t_loop(local_238);
  uVar7 = local_1d8._24_8_;
  local_338._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_338._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_338._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_338._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)local_1d8._24_8_;
  if ((_Elt_pointer)local_1d8._16_8_ != (_Elt_pointer)0x0) {
    local_338._M_impl.super__Deque_impl_data._M_map =
         (_Map_pointer)CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
    local_338._M_impl.super__Deque_impl_data._M_map_size =
         CONCAT44(local_1d8._12_4_,local_1d8._8_4_);
    local_338._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)local_1d8._16_8_;
    local_1d8._16_8_ = (_Elt_pointer)0x0;
    local_1d8._24_8_ = (_Elt_pointer)0x0;
  }
  local_1b8.first.field_2._M_allocated_capacity._0_4_ = 0;
  local_1b8.first.field_2._M_allocated_capacity._4_4_ = 0;
  local_1b8.first.field_2._8_5_ = 0;
  local_1b8.first.field_2._13_2_ = 0;
  local_1b8.first.field_2._M_local_buf[0xf] = '\0';
  local_1b8.first._M_dataplus._M_p = (pointer)0x0;
  local_1b8.first._M_string_length = 0;
  puVar8 = (undefined8 *)operator_new(0x20);
  uVar6 = local_1d8._16_8_;
  *puVar8 = 0;
  puVar8[1] = 0;
  puVar8[2] = 0;
  puVar8[3] = uVar7;
  if (local_338._M_impl.super__Deque_impl_data._M_start._M_cur != (_Elt_pointer)0x0) {
    *puVar8 = local_338._M_impl.super__Deque_impl_data._M_map;
    puVar8[1] = local_338._M_impl.super__Deque_impl_data._M_map_size;
    puVar8[2] = local_338._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_338._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_338._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  }
  local_1b8.first._M_dataplus._M_p._0_4_ = SUB84(puVar8,0);
  local_1b8.first._M_dataplus._M_p._4_4_ = (undefined4)((ulong)puVar8 >> 0x20);
  local_268._M_impl._0_4_ = local_1b8.first._M_dataplus._M_p._0_4_;
  local_268._M_impl._4_4_ = local_1b8.first._M_dataplus._M_p._4_4_;
  local_268._M_impl.super__Rb_tree_header._M_header._M_color =
       (_Rb_tree_color)local_1b8.first._M_string_length;
  local_268._M_impl.super__Rb_tree_header._M_header._4_4_ = local_1b8.first._M_string_length._4_4_;
  local_1d8._0_4_ = local_1b8.first._M_dataplus._M_p._0_4_;
  local_1d8._4_4_ = local_1b8.first._M_dataplus._M_p._4_4_;
  local_1d8._8_4_ = (_Rb_tree_color)local_1b8.first._M_string_length;
  local_1d8._12_4_ = local_1b8.first._M_string_length._4_4_;
  local_1b8.first.field_2._M_allocated_capacity._0_4_ = (undefined4)local_1d8._16_8_;
  local_1b8.first.field_2._M_allocated_capacity._4_4_ = SUB84(local_1d8._16_8_,4);
  local_1d8._16_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:12:16)>
       ::_M_manager;
  local_1b8.first.field_2._8_5_ = (undefined5)local_1d8._24_8_;
  local_1b8.first.field_2._13_2_ = SUB82(local_1d8._24_8_,5);
  local_1b8.first.field_2._M_local_buf[0xf] = SUB81(local_1d8._24_8_,7);
  local_1d8._24_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:12:16)>
       ::_M_invoke;
  if ((_Elt_pointer)uVar6 != (_Elt_pointer)0x0) {
    (*(code *)uVar6)(&local_1b8,&local_1b8,3);
  }
  if (local_338._M_impl.super__Deque_impl_data._M_start._M_cur != (_Elt_pointer)0x0) {
    (*(code *)local_338._M_impl.super__Deque_impl_data._M_start._M_cur)(&local_338,&local_338,3);
  }
  local_338._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_338._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_338._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_338._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_338._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_338._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_338._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_338._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_338._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_338._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
  ::_M_initialize_map(&local_338,0);
  uVar4 = uStack_274;
  uVar3 = uStack_2d4;
  uVar2 = uStack_344;
  uVar1 = uStack_364;
  local_358 = &local_348;
  uStack_344 = uStack_344 & 0xffffff00;
  local_1b8.first._M_dataplus._M_p = (pointer)&local_1b8.first.field_2;
  local_1b8.first.field_2._M_allocated_capacity._0_4_ = 0x74697571;
  local_1b8.first.field_2._M_allocated_capacity._4_4_ = uVar2 & 0xffffff00;
  local_1b8.first.field_2._13_2_ = local_33b;
  local_1b8.first.field_2._M_local_buf[0xf] = local_339;
  local_1b8.first._M_string_length = 4;
  local_350 = 0;
  local_348 = 0x74697500;
  local_1b8.second.super__Function_base._M_functor._8_8_ = 0;
  local_1b8.second._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:20:13)>
       ::_M_invoke;
  local_1b8.second.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:20:13)>
       ::_M_manager;
  local_378 = &local_368;
  uStack_364 = uStack_364 & 0xffffff00;
  uVar2 = uStack_364;
  local_178 = &local_168;
  local_168 = 0x6f686365;
  local_164 = 0;
  uStack_364._1_3_ = SUB43(uVar1,1);
  local_163 = CONCAT53(uStack_360,uStack_364._1_3_);
  local_15b = local_35b;
  local_159 = local_359;
  local_170 = 4;
  local_370 = 0;
  local_368 = 0x6f686300;
  local_158 = 0;
  uStack_150 = 0;
  local_140 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:24:13)>
              ::_M_invoke;
  local_148 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:24:13)>
              ::_M_manager;
  uStack_274 = uStack_274 & 0xffffff00;
  uVar5 = uStack_274;
  local_138 = &local_128;
  local_128 = 0x74736f70;
  local_124 = 0;
  uStack_274._1_3_ = SUB43(uVar4,1);
  local_123 = CONCAT53(uStack_270,uStack_274._1_3_);
  local_11b = local_26b;
  local_119 = local_269;
  local_130 = 4;
  local_280 = 0;
  local_278 = 0x74736f00;
  uStack_110 = 0;
  pcStack_100 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:30:13)>
                ::_M_invoke;
  local_108 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:30:13)>
              ::_M_manager;
  uStack_297 = 0x6e;
  uStack_296 = 0;
  local_f8 = &local_e8;
  local_e8 = 0x6e69;
  local_e6 = 0;
  local_dd = local_28d;
  local_d9 = local_289;
  local_f0 = 2;
  local_2a0 = 0;
  local_298 = 0;
  uStack_d0 = 0;
  pcStack_c0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:39:11)>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:39:11)>
             ::_M_manager;
  uStack_2b4 = 0x79;
  local_b8 = &local_a8;
  local_a8 = 0x72657665;
  local_a4 = 0x79;
  local_9a = local_2aa;
  local_b0 = 5;
  local_2c0 = 0;
  local_2b8 = 0x72657600;
  pcStack_80 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:49:14)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:49:14)>
             ::_M_manager;
  uStack_2d4 = uStack_2d4 & 0xffffff00;
  uVar1 = uStack_2d4;
  local_68._0_4_ = 0x706f7473;
  local_68[4] = 0;
  uStack_2d4._1_3_ = SUB43(uVar3,1);
  local_68._5_8_ = CONCAT53(uStack_2d0,uStack_2d4._1_3_);
  local_5b = local_2cb;
  local_59 = local_2c9;
  local_78[1] = (undefined4 *)0x4;
  local_2e0 = 0;
  local_2d8 = 0x706f7400;
  uStack_50 = 0;
  local_48[1] = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:59:13)>
                ::_M_invoke;
  local_48[0] = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/shin1m[P]suisha/examples/test.cc:59:13)>
                ::_M_manager;
  __l._M_len = 6;
  __l._M_array = &local_1b8;
  uStack_364 = uVar2;
  local_2e8 = &local_2d8;
  uStack_2d4 = uVar1;
  local_2c8 = &local_2b8;
  local_2a8 = &local_298;
  local_288 = &local_278;
  uStack_274 = uVar5;
  local_1b8.second.super__Function_base._M_functor._M_unused._0_8_ = (undefined8)local_238;
  local_118 = local_238;
  local_d8 = local_238;
  local_98 = &local_338;
  ptStack_90 = local_238;
  local_78[0] = (undefined4 *)local_68;
  local_58 = &local_338;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
         *)&local_268,__l,&local_379,&local_37a);
  lVar9 = 0;
  do {
    if (*(code **)((long)local_48 + lVar9) != (code *)0x0) {
      (**(code **)((long)local_48 + lVar9))((long)&local_58 + lVar9,(long)&local_58 + lVar9,3);
    }
    if ((undefined1 *)((long)local_68 + lVar9) != *(undefined1 **)((long)local_78 + lVar9)) {
      operator_delete(*(undefined1 **)((long)local_78 + lVar9),*(long *)(local_68 + lVar9) + 1);
    }
    lVar9 = lVar9 + -0x40;
  } while (lVar9 != -0x180);
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,CONCAT44(uStack_2d4,local_2d8) + 1);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,CONCAT26(uStack_2b2,CONCAT24(uStack_2b4,local_2b8)) + 1);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,
                    CONCAT53(uStack_295,CONCAT12(uStack_296,CONCAT11(uStack_297,local_298))) + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,CONCAT44(uStack_274,local_278) + 1);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378,CONCAT44(uStack_364,local_368) + 1);
  }
  if (local_358 != &local_348) {
    operator_delete(local_358,CONCAT44(uStack_344,local_348) + 1);
  }
  local_1b8.first._M_string_length = 0;
  local_1b8.first._M_dataplus._M_p = (pointer)&local_268;
  local_1b8.first.field_2._8_5_ = 0x10374a;
  local_1b8.first.field_2._13_2_ = 0;
  local_1b8.first.field_2._M_local_buf[0xf] = '\0';
  local_1b8.first.field_2._M_allocated_capacity._0_4_ = 0x10384c;
  local_1b8.first.field_2._M_allocated_capacity._4_4_ = 0;
  suisha::t_loop::f_poll((int)local_238,false,true,(function *)0x0);
  if ((code *)CONCAT44(local_1b8.first.field_2._M_allocated_capacity._4_4_,
                       local_1b8.first.field_2._M_allocated_capacity._0_4_) != (code *)0x0) {
    (*(code *)CONCAT44(local_1b8.first.field_2._M_allocated_capacity._4_4_,
                       local_1b8.first.field_2._M_allocated_capacity._0_4_))
              (&local_1b8,&local_1b8,3);
  }
  suisha::t_loop::f_run();
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
  ::~_Rb_tree(&local_268);
  std::deque<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>::
  ~deque((deque<std::shared_ptr<suisha::t_timer>,_std::allocator<std::shared_ptr<suisha::t_timer>_>_>
          *)&local_338);
  suisha::t_loop::~t_loop(local_238);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	t_loop loop;
	loop.v_wait = [wait = std::move(loop.v_wait)]
	{
		std::cout << "before wait"sv << std::endl;
		wait();
		std::cout << "after wait"sv << std::endl;
	};
	std::deque<std::shared_ptr<t_timer>> timers;
	std::map<std::string, std::function<void()>> commands = {
		{"quit"s, [&]
		{
			loop.f_exit();
		}},
		{"echo"s, []
		{
			std::string value;
			std::cin >> value;
			std::cout << value << std::endl;
		}},
		{"post"s, [&]
		{
			std::string value;
			std::cin >> value;
			loop.f_post([value]
			{
				std::cout << "posted: "sv << value << std::endl;
			});
		}},
		{"in"s, [&]
		{
			size_t interval;
			std::string value;
			std::cin >> interval >> value;
			loop.f_timer([value]
			{
				std::cout << "single: "sv << value << std::endl;
			}, std::chrono::milliseconds(interval), true);
		}},
		{"every"s, [&]
		{
			size_t interval;
			std::string value;
			std::cin >> interval >> value;
			timers.push_back(loop.f_timer([value]
			{
				std::cout << "repeat: "sv << value << std::endl;
			}, std::chrono::milliseconds(interval)));
		}},
		{"stop"s, [&]
		{
			timers.front()->f_stop();
			timers.pop_front();
		}}
	};
	try {
		loop.f_poll(0, true, false, [&](bool a_readable, bool a_writable)
		{
			if (!a_readable) return;
			std::string command;
			std::cin >> command;
			auto i = commands.find(command);
			if (i == commands.end())
				std::cerr << "unknown command: "sv << command << std::endl;
			else
				i->second();
		});
		loop.f_run();
		return EXIT_SUCCESS;
	} catch (std::exception& e) {
		std::cerr << "Error: "sv << e.what() << std::endl;
		return EXIT_FAILURE;
	}
}